

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce_load_size.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ReduceLoadSize::ReplaceExtract(ReduceLoadSize *this,Instruction *inst)

{
  DefUseManager *this_00;
  TypeManager *this_01;
  ConstantManager *this_02;
  uint uVar1;
  Analysis AVar2;
  uint32_t uVar3;
  StorageClass storage_class;
  iterator this_03;
  Type *pTVar4;
  Instruction *pIVar5;
  Constant *c;
  uint32_t uVar6;
  uint32_t after;
  IRContext *pIVar7;
  uint uVar8;
  IRContext *this_04;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  InstructionBuilder ir_builder;
  Integer int_type;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  InstructionBuilder local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  Type local_60;
  undefined1 local_38;
  
  if (inst->opcode_ != OpCompositeExtract) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeExtract && \"Wrong opcode.  Should be OpCompositeExtract.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp"
                  ,0x33,"bool spvtools::opt::ReduceLoadSize::ReplaceExtract(Instruction *)");
  }
  pIVar7 = (this->super_Pass).context_;
  AVar2 = pIVar7->valid_analyses_;
  this_04 = pIVar7;
  if ((AVar2 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar7);
    this_04 = (this->super_Pass).context_;
    AVar2 = this_04->valid_analyses_;
  }
  this_00 = (pIVar7->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  pIVar7 = this_04;
  if (-1 < (short)AVar2) {
    IRContext::BuildTypeManager(this_04);
    pIVar7 = (this->super_Pass).context_;
    AVar2 = pIVar7->valid_analyses_;
  }
  this_01 = (this_04->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if ((AVar2 >> 0xe & 1) == 0) {
    IRContext::BuildConstantManager(pIVar7);
  }
  this_02 = (pIVar7->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  uVar3 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar3 = (uint)inst->has_result_id_;
  }
  uVar3 = Instruction::GetSingleWordOperand(inst,uVar3);
  this_03.node_ = analysis::DefUseManager::GetDef(this_00,uVar3);
  uVar6 = 0;
  uVar3 = 0;
  if ((this_03.node_)->opcode_ == OpLoad) {
    if ((this_03.node_)->has_type_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(this_03.node_,0);
    }
    pTVar4 = analysis::TypeManager::GetType(this_01,uVar3);
    if ((pTVar4->kind_ & ~kBool) != kVector) {
      pIVar5 = Instruction::GetBaseAddress(this_03.node_);
      if ((pIVar5 != (Instruction *)0x0) && (pIVar5->opcode_ == OpVariable)) {
        uVar3 = (pIVar5->has_result_id_ & 1) + 1;
        if (pIVar5->has_type_id_ == false) {
          uVar3 = (uint)pIVar5->has_result_id_;
        }
        storage_class = Instruction::GetSingleWordOperand(pIVar5,uVar3);
        uVar6 = 0;
        if (storage_class < Output) {
          pIVar7 = inst->context_;
          local_98.parent_ = IRContext::get_instr_block(pIVar7,this_03.node_);
          local_98.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
          local_98.context_ = pIVar7;
          local_98.insert_before_.super_iterator.node_ = (iterator)(iterator)this_03.node_;
          if (inst->has_type_id_ == true) {
            uVar6 = Instruction::GetSingleWordOperand(inst,0);
          }
          uVar3 = analysis::TypeManager::FindPointerToType(this_01,uVar6,storage_class);
          if (uVar3 == 0) {
            __assert_fail("pointer_to_result_type_id != 0 && \"We did not find the pointer type that we need.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp"
                          ,0x60,"bool spvtools::opt::ReduceLoadSize::ReplaceExtract(Instruction *)")
            ;
          }
          local_60.decorations_.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_60.decorations_.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_60.decorations_.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_60.kind_ = kInteger;
          local_60._36_4_ = 0x20;
          local_60._vptr_Type = (_func_int **)&PTR__Type_00935568;
          local_38 = 0;
          pTVar4 = analysis::TypeManager::GetRegisteredType(this_01,&local_60);
          local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
          local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (uint *)0x0;
          uVar1 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar1 = (uint)inst->has_result_id_;
          }
          if (1 < (int)((ulong)((long)(inst->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(inst->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
                  - uVar1) {
            uVar8 = 1;
            do {
              uVar6 = Instruction::GetSingleWordOperand(inst,uVar1 + uVar8);
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)operator_new(4);
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
              *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start = uVar6;
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              c = analysis::ConstantManager::GetConstant(this_02,pTVar4,&local_d8);
              if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (uint32_t *)0x0) {
                operator_delete(local_d8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_d8.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              uVar6 = 0;
              pIVar5 = analysis::ConstantManager::GetDefiningInstruction
                                 (this_02,c,0,(inst_iterator *)0x0);
              if (pIVar5->has_result_id_ == true) {
                uVar6 = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
              }
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_d8.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar6);
              if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&local_b8,
                           (iterator)
                           local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d8);
              }
              else {
                *local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = uVar6;
                local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              uVar8 = uVar8 + 1;
              uVar1 = (inst->has_result_id_ & 1) + 1;
              if (inst->has_type_id_ == false) {
                uVar1 = (uint)inst->has_result_id_;
              }
            } while (uVar8 < (int)((ulong)((long)(inst->operands_).
                                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(inst->operands_).
                                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                             -0x55555555 - uVar1);
          }
          uVar6 = ((this_03.node_)->has_result_id_ & 1) + 1;
          if ((this_03.node_)->has_type_id_ == false) {
            uVar6 = (uint)(this_03.node_)->has_result_id_;
          }
          uVar6 = Instruction::GetSingleWordOperand(this_03.node_,uVar6);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_78,&local_b8);
          pIVar5 = InstructionBuilder::AddAccessChain(&local_98,uVar3,uVar6,&local_78);
          if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar6 = 0;
          uVar3 = 0;
          if (inst->has_type_id_ == true) {
            uVar3 = Instruction::GetSingleWordOperand(inst,0);
          }
          if (pIVar5->has_result_id_ == true) {
            uVar6 = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
          }
          after = 0;
          pIVar5 = InstructionBuilder::AddLoad(&local_98,uVar3,uVar6,0);
          pIVar7 = (this->super_Pass).context_;
          uVar3 = 0;
          if (inst->has_result_id_ == true) {
            uVar3 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
          }
          if (pIVar5->has_result_id_ == true) {
            after = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
          }
          IRContext::ReplaceAllUsesWith(pIVar7,uVar3,after);
          IRContext::KillInst((this->super_Pass).context_,inst);
          if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_b8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_60._vptr_Type = (_func_int **)&PTR__Type_00930d10;
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::~vector(&local_60.decorations_);
          uVar6 = 1;
        }
        goto LAB_0052ade1;
      }
    }
    uVar6 = 0;
  }
LAB_0052ade1:
  return SUB41(uVar6,0);
}

Assistant:

bool ReduceLoadSize::ReplaceExtract(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCompositeExtract &&
         "Wrong opcode.  Should be OpCompositeExtract.");
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();

  uint32_t composite_id =
      inst->GetSingleWordInOperand(kExtractCompositeIdInIdx);
  Instruction* composite_inst = def_use_mgr->GetDef(composite_id);

  if (composite_inst->opcode() != spv::Op::OpLoad) {
    return false;
  }

  analysis::Type* composite_type = type_mgr->GetType(composite_inst->type_id());
  if (composite_type->kind() == analysis::Type::kVector ||
      composite_type->kind() == analysis::Type::kMatrix) {
    return false;
  }

  Instruction* var = composite_inst->GetBaseAddress();
  if (var == nullptr || var->opcode() != spv::Op::OpVariable) {
    return false;
  }

  spv::StorageClass storage_class = static_cast<spv::StorageClass>(
      var->GetSingleWordInOperand(kVariableStorageClassInIdx));
  switch (storage_class) {
    case spv::StorageClass::Uniform:
    case spv::StorageClass::UniformConstant:
    case spv::StorageClass::Input:
      break;
    default:
      return false;
  }

  // Create a new access chain and load just after the old load.
  // We cannot create the new access chain load in the position of the extract
  // because the storage may have been written to in between.
  InstructionBuilder ir_builder(
      inst->context(), composite_inst,
      IRContext::kAnalysisInstrToBlockMapping | IRContext::kAnalysisDefUse);

  uint32_t pointer_to_result_type_id =
      type_mgr->FindPointerToType(inst->type_id(), storage_class);
  assert(pointer_to_result_type_id != 0 &&
         "We did not find the pointer type that we need.");

  analysis::Integer int_type(32, false);
  const analysis::Type* uint32_type = type_mgr->GetRegisteredType(&int_type);
  std::vector<uint32_t> ids;
  for (uint32_t i = 1; i < inst->NumInOperands(); ++i) {
    uint32_t index = inst->GetSingleWordInOperand(i);
    const analysis::Constant* index_const =
        const_mgr->GetConstant(uint32_type, {index});
    ids.push_back(const_mgr->GetDefiningInstruction(index_const)->result_id());
  }

  Instruction* new_access_chain = ir_builder.AddAccessChain(
      pointer_to_result_type_id,
      composite_inst->GetSingleWordInOperand(kLoadPointerInIdx), ids);
  Instruction* new_load =
      ir_builder.AddLoad(inst->type_id(), new_access_chain->result_id());

  context()->ReplaceAllUsesWith(inst->result_id(), new_load->result_id());
  context()->KillInst(inst);
  return true;
}